

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.c
# Opt level: O0

int readline(char *pl)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  undefined1 *puVar5;
  undefined1 *in_RDI;
  bool bVar6;
  int sp;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  char *local_10;
  int local_4;
  
  local_10 = in_RDI;
  if (c == -1) {
    local_4 = 0;
  }
  else {
    while (c != -1) {
      readbyte();
      iVar2 = tabstop;
      if (c == -1) {
        if (mlc != 0) {
          err(E,"unterminated comment");
        }
      }
      else {
        if (c == 10) {
          if (l == 0xd) {
            readbyte();
          }
          *local_10 = 10;
          local_10 = local_10 + 1;
          break;
        }
        if (c == 0xd) {
          if (l == 10) {
            readbyte();
          }
          *local_10 = 10;
          local_10 = local_10 + 1;
          break;
        }
        if (c == 9) {
          iVar3 = tabstop - column % tabstop;
          column = iVar3 + column;
          while (in_stack_ffffffffffffffec = iVar3 + -1, in_stack_ffffffffffffffe8 = iVar2,
                iVar3 != 0) {
            *local_10 = 0x20;
            iVar3 = in_stack_ffffffffffffffec;
            local_10 = local_10 + 1;
          }
        }
        else if (((mlc == 0) && (c == 0x2f)) && (l == 0x2f)) {
          while( true ) {
            bVar6 = false;
            if ((l != 10) && (bVar6 = false, l != 0xd)) {
              bVar6 = l != 0xb;
            }
            if (!bVar6) break;
            readbyte();
          }
        }
        else if (((mlc == 0) && (c == 0x2f)) && (l == 0x2a)) {
          readbyte();
          puVar5 = local_10 + 1;
          *local_10 = 0x20;
          local_10 = local_10 + 2;
          *puVar5 = 0x20;
          mlc = 1;
        }
        else if (((mlc == 0) || (c != 0x2a)) || (l != 0x2f)) {
          column = column + 1;
          if (mlc == 0) {
            *local_10 = (char)c;
          }
          else {
            *local_10 = 0x20;
          }
          local_10 = local_10 + 1;
        }
        else {
          readbyte();
          puVar5 = local_10 + 1;
          *local_10 = 0x20;
          local_10 = local_10 + 2;
          *puVar5 = 0x20;
          mlc = 0;
          eline = line;
          ecolumn = column;
        }
      }
      if (0xfff < column) {
        ccerr(F,"line too long in file \"%s\" at line %d",filnam,(ulong)(uint)line);
      }
    }
    *local_10 = 0;
    local_10 = linebuf;
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*local_10] & 0x2000) != 0) {
      local_10 = local_10 + 1;
    }
    if (*local_10 == '\0') {
      linebuf[0] = '\n';
      linebuf[1] = '\0';
      local_4 = 1;
    }
    else {
      for (; pcVar1 = local_10, *local_10 != '\0'; local_10 = local_10 + 1) {
      }
      while( true ) {
        local_10 = pcVar1 + -1;
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[(int)*local_10] & 0x2000) == 0) break;
        column = column + -1;
        pcVar1 = local_10;
      }
      if (*local_10 == '\\') {
        line = line + 1;
        readline((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
        update_line = 1;
      }
      else {
        column = column + -1;
        *pcVar1 = '\n';
        pcVar1[1] = '\0';
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int readline(char* pl)
{
    if (c == EOF)
        return 0;

    while (c != EOF)
    {
        readbyte();

        if (c == EOF)
        {
            if (mlc)
                err(E, "unterminated comment");

        }
        else if (c == '\n')
        {
            if (l == '\r')
                readbyte();

            *pl++ = '\n';
            break;
        }
        else if (c == '\r')
        {
            if (l == '\n')
                readbyte();

            *pl++ = '\n';
            break;
        }
        else if (c == '\t')
        {
            int sp = tabstop - (column % tabstop);
            column += sp;
            while (sp--)
                *pl++ = ' ';
        }
        /*else if (c == '\v')
        {

        } */
        else if (!mlc && c == '/' && l == '/')
        {
            while (l != '\n' && l != '\r' && l != '\v')
                readbyte();
        }
        else if (!mlc && c == '/' && l == '*')
        {
            readbyte();
            *pl++ = ' ';
            *pl++ = ' ';
            mlc = 1;
        }
        else if (mlc && c == '*' && l == '/')
        {
            readbyte();
            *pl++ = ' ';
            *pl++ = ' ';
            mlc = 0;

            eline = line;
            ecolumn = column;
        }
        else
        {
            ++column;
            if (mlc)
                *pl++ = ' ';
            else
                *pl++ = c;
        }

        if (column >= BUFSIZE)
            ccerr(F, "line too long in file \"%s\" at line %d", filnam, line);
    }
    *pl = 0;
    
    pl = linebuf;
    while (isspace(*pl))
        pl++;
    
    /* empty line ? */
    if (!*pl)
    {
        linebuf[0] = '\n';
        linebuf[1] = 0;
        return 1;
    }
    
    /* search for the last non white character of the line */
    while (*pl)
        ++pl;
    --pl;
    
    while (isspace(*pl))
    {
        --pl;
        --column;
    }
    
    /* merge lines or remove trailing spaces */
    if (*pl == '\\')
    {
        ++line;
        readline(pl);
        update_line = 1;
    }
    else
    {
        --column;
        *++pl = '\n';
        *++pl = 0;
    }
    
    return 1;
}